

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_many_nulls.cc
# Opt level: O3

int main(int argc,char **argv)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  char *pcVar1;
  ostream *poVar2;
  int iVar3;
  int iVar4;
  QPDFObjectHandle QVar5;
  QPDFObjectHandle QVar6;
  QPDF q;
  QPDFWriter w;
  QPDFObjectHandle top;
  QPDFObjectHandle null;
  QPDF local_100 [8];
  QPDFObjectHandle local_f8;
  long local_e8 [2];
  element_type *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_d0;
  QPDFObjectHandle local_c8;
  long *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  long local_a8 [2];
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  element_type *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  char *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  QPDFObjectHandle local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  pcVar1 = (char *)QUtil::getWhoami(*argv);
  if (argc == 2) {
    pcVar1 = argv[1];
    QPDF::QPDF(local_100);
    QPDF::emptyPDF();
    QPDFObjectHandle::newNull();
    local_78 = pcVar1;
    operator____qpdf((char *)&local_c8,0x103019);
    iVar4 = 0;
    do {
      operator____qpdf((char *)&local_f8,0x103019);
      iVar3 = 20000;
      do {
        QPDFObjectHandle::appendItem(&local_f8);
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      QPDFObjectHandle::appendItem(&local_c8);
      if (local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_f8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0x14);
    QPDF::getTrailer();
    local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"/Nulls","");
    local_88 = local_c8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_80 = local_c8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_c8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8) =
             *(int *)(local_c8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
                     8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_c8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 8) =
             *(int *)(local_c8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi +
                     8) + 1;
      }
    }
    QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100;
    QVar5.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_d8;
    QPDF::makeIndirectObject(QVar5);
    QPDFObjectHandle::replaceKey((string *)&local_b8,&local_f8);
    if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
    }
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    }
    if (local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)local_e8) {
      operator_delete(local_f8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_e8[0] + 1);
    }
    if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
    }
    operator____qpdf((char *)&local_d8,0x103023);
    local_98 = local_d8;
    local_90 = p_Stack_d0;
    if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(p_Stack_d0 + 8) = *(int *)(p_Stack_d0 + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(p_Stack_d0 + 8) = *(int *)(p_Stack_d0 + 8) + 1;
      }
    }
    QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100;
    QVar6.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&local_f8;
    QPDF::makeIndirectObject(QVar6);
    this = p_Stack_d0;
    p_Stack_d0 = local_f8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_d8 = local_f8.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
      if (local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_f8.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
    }
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
    }
    QPDF::getRoot();
    local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"/Pages","");
    QPDFObjectHandle::getKey(local_60);
    local_b8 = local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"/Kids","");
    QPDFObjectHandle::getKey((string *)&local_50);
    QPDFObjectHandle::appendItem(&local_50);
    if (local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_b8 != local_a8) {
      operator_delete(local_b8,local_a8[0] + 1);
    }
    pcVar1 = local_78;
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    if (local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)local_e8) {
      operator_delete(local_f8.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      local_e8[0] + 1);
    }
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    }
    QPDFWriter::QPDFWriter((QPDFWriter *)&local_f8,local_100,pcVar1);
    QPDFWriter::setObjectStreamMode((qpdf_object_stream_e)&local_f8);
    QPDFWriter::setDeterministicID(SUB81(&local_f8,0));
    QPDFWriter::write();
    if (local_f8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_f8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (p_Stack_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_d0);
    }
    if (local_c8.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    QPDF::~QPDF(local_100);
    return 0;
  }
  poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2," outfile.pdf");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(2);
}

Assistant:

int
main(int argc, char* argv[])
{
    auto whoami = QUtil::getWhoami(argv[0]);
    if (argc != 2) {
        std::cerr << "Usage: " << whoami << " outfile.pdf" << std::endl;
        exit(2);
    }
    char const* outfile = argv[1];

    // Create a file with lots of arrays containing very large numbers
    // of nulls. Prior to qpdf 9.0.0, qpdf had a lot of trouble with
    // this kind of file. This program is used to generate a file that
    // can be used in the test suite and performance benchmarking.
    QPDF q;
    q.emptyPDF();
    auto null = QPDFObjectHandle::newNull();
    auto top = "[]"_qpdf;
    for (int i = 0; i < 20; ++i) {
        auto inner = "[]"_qpdf;
        for (int j = 0; j < 20000; ++j) {
            inner.appendItem(null);
        }
        top.appendItem(inner);
    }
    q.getTrailer().replaceKey("/Nulls", q.makeIndirectObject(top));
    auto page = "<< /Type /Page /MediaBox [0 0 612 792] >>"_qpdf;
    page = q.makeIndirectObject(page);
    q.getRoot().getKey("/Pages").getKey("/Kids").appendItem(page);
    QPDFWriter w(q, outfile);
    w.setObjectStreamMode(qpdf_o_generate);
    w.setDeterministicID(true);
    w.write();
    return 0;
}